

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

DeviceContextIndex __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::GetExecutionCtxId
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  DeviceContextIndex *pDVar2;
  string msg;
  string local_30;
  
  if ((this->m_Desc).IsDeferred == true) {
    bVar1 = IsRecordingDeferredCommands(this);
    if (!bVar1) {
      FormatString<char[110]>
                (&local_30,
                 (char (*) [110])
                 "For deferred contexts, the execution context id may only be requested while the context is in recording state"
                );
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"GetExecutionCtxId",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x15c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pDVar2 = (DeviceContextIndex *)&(this->m_Desc).ContextId;
  if ((this->m_Desc).IsDeferred != false) {
    pDVar2 = &this->m_DstImmediateContextId;
  }
  return (DeviceContextIndex)pDVar2->m_Value;
}

Assistant:

DeviceContextIndex GetExecutionCtxId() const
    {
        VERIFY(!IsDeferred() || IsRecordingDeferredCommands(),
               "For deferred contexts, the execution context id may only be requested while the context is in recording state");
        return IsDeferred() ? m_DstImmediateContextId : GetContextId();
    }